

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeSetCreate(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val_00;
  xmlNodeSetPtr val_01;
  int local_24;
  int n_val;
  xmlNodePtr val;
  xmlNodeSetPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    iVar1 = xmlMemBlocks();
    val_00 = gen_xmlNodePtr(local_24,0);
    val_01 = (xmlNodeSetPtr)xmlXPathNodeSetCreate(val_00);
    desret_xmlNodeSetPtr(val_01);
    call_tests = call_tests + 1;
    des_xmlNodePtr(local_24,val_00,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetCreate",(ulong)(uint)(iVar2 - iVar1));
      ret_val._4_4_ = ret_val._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlXPathNodeSetCreate(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodeSetPtr ret_val;
    xmlNodePtr val; /* an initial xmlNodePtr, or NULL */
    int n_val;

    for (n_val = 0;n_val < gen_nb_xmlNodePtr;n_val++) {
        mem_base = xmlMemBlocks();
        val = gen_xmlNodePtr(n_val, 0);

        ret_val = xmlXPathNodeSetCreate(val);
        desret_xmlNodeSetPtr(ret_val);
        call_tests++;
        des_xmlNodePtr(n_val, val, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeSetCreate",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_val);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}